

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderDrawCallsWhileTFPaused::iterate(GeometryShaderDrawCallsWhileTFPaused *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  NotSupportedError *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  string *local_a78;
  string *local_a58;
  string *local_a18;
  string *local_a00;
  byte local_9c6;
  byte local_9c5;
  string *local_920;
  MessageBuilder local_860;
  int local_6dc;
  int local_6d8;
  int k;
  int j_1;
  int i_4;
  char *local_550;
  char *gs_code_specialized_raw;
  string gs_code_specialized;
  char *gs_code;
  char *pcStack_518;
  int i_3;
  char *vs_code_specialized_raw;
  string vs_code_specialized;
  char *fs_code_specialized_raw;
  string fs_code_specialized;
  char *pcStack_4c0;
  int i_2;
  char *tf_varyings [1];
  int i_1;
  Functions *gl;
  GLuint draw_call_modes [5];
  GLuint tf_modes [3];
  bool result;
  bool has_shader_compilation_failed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  ulong local_3c0;
  size_t j;
  size_t i;
  string local_3a8 [4];
  GLenum errorCode;
  string gs_codes [15];
  unsigned_short number_of_combinations;
  string local_1b8 [8];
  string gs_max_output_vertices [3];
  string local_148 [8];
  string gs_outputs [3];
  allocator<char> local_d8;
  allocator<char> local_d7;
  allocator<char> local_d6;
  allocator<char> local_d5 [20];
  allocator<char> local_c1;
  string *local_c0;
  string local_b8 [8];
  string gs_inputs [5];
  GeometryShaderDrawCallsWhileTFPaused *this_local;
  long lVar6;
  
  local_c0 = local_b8;
  gs_inputs[4].field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"points",&local_c1);
  local_c0 = (string *)(gs_inputs[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(gs_inputs[0].field_2._M_local_buf + 8),"lines",local_d5);
  local_c0 = (string *)(gs_inputs[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(gs_inputs[1].field_2._M_local_buf + 8),"lines_adjacency",&local_d6);
  local_c0 = (string *)(gs_inputs[2].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(gs_inputs[2].field_2._M_local_buf + 8),"triangles",&local_d7);
  local_c0 = (string *)(gs_inputs[3].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(gs_inputs[3].field_2._M_local_buf + 8),"triangles_adjacency",&local_d8);
  std::allocator<char>::~allocator(&local_d8);
  std::allocator<char>::~allocator(&local_d7);
  std::allocator<char>::~allocator(&local_d6);
  std::allocator<char>::~allocator(local_d5);
  std::allocator<char>::~allocator(&local_c1);
  gs_max_output_vertices[2].field_2._M_local_buf[0xc] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"points",
             (allocator<char> *)(gs_max_output_vertices[2].field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(gs_outputs[0].field_2._M_local_buf + 8),"line_strip",
             (allocator<char> *)(gs_max_output_vertices[2].field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(gs_outputs[1].field_2._M_local_buf + 8),"triangle_strip",
             (allocator<char> *)(gs_max_output_vertices[2].field_2._M_local_buf + 0xd));
  gs_max_output_vertices[2].field_2._M_local_buf[0xc] = '\0';
  std::allocator<char>::~allocator
            ((allocator<char> *)(gs_max_output_vertices[2].field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator
            ((allocator<char> *)(gs_max_output_vertices[2].field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator
            ((allocator<char> *)(gs_max_output_vertices[2].field_2._M_local_buf + 0xf));
  gs_codes[0xe].field_2._M_local_buf[0xc] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,"1",(allocator<char> *)(gs_codes[0xe].field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(gs_max_output_vertices[0].field_2._M_local_buf + 8),"2",
             (allocator<char> *)(gs_codes[0xe].field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(gs_max_output_vertices[1].field_2._M_local_buf + 8),"3",
             (allocator<char> *)(gs_codes[0xe].field_2._M_local_buf + 0xd));
  gs_codes[0xe].field_2._M_local_buf[0xc] = '\0';
  std::allocator<char>::~allocator((allocator<char> *)(gs_codes[0xe].field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator((allocator<char> *)(gs_codes[0xe].field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(gs_codes[0xe].field_2._M_local_buf + 0xf));
  gs_codes[0xe].field_2._10_2_ = 0xf;
  local_920 = local_3a8;
  do {
    std::__cxx11::string::string(local_920);
    local_920 = local_920 + 0x20;
  } while (local_920 != (string *)((long)&gs_codes[0xe].field_2 + 8));
  for (j = 0; j < 5; j = j + 1) {
    for (local_3c0 = 0; local_3c0 < 3; local_3c0 = local_3c0 + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (tf_modes + 2),"${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&gs_inputs[j - 1].field_2 + 8));
      std::operator+(&local_460,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (tf_modes + 2),") in;\nlayout (");
      std::operator+(&local_440,&local_460,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&gs_outputs[local_3c0 - 1].field_2 + 8));
      std::operator+(&local_420,&local_440,", max_vertices = ");
      std::operator+(&local_400,&local_420,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&gs_max_output_vertices[local_3c0 - 1].field_2 + 8));
      std::operator+(&local_3e0,&local_400,
                     ") out;\n\nout vec2 out_gs_1;\n\nvoid main()\n{\n    out_gs_1    = vec2(1.0, 2.0);\n    gl_Position = vec4(0, 0, 0, 1);\n    EmitVertex();\n}\n"
                    );
      std::__cxx11::string::operator=(local_3a8 + (local_3c0 + j * 3) * 0x20,(string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_400);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string((string *)&local_440);
      std::__cxx11::string::~string((string *)&local_460);
      std::__cxx11::string::~string((string *)(tf_modes + 2));
    }
  }
  tf_modes[1]._3_1_ = 1;
  tf_modes[1]._2_1_ = 1;
  stack0xfffffffffffffb70 = 0x100000000;
  tf_modes[0] = 4;
  draw_call_modes[0] = 10;
  draw_call_modes[1] = 4;
  draw_call_modes[2] = 0xc;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0x10b3);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  for (tf_varyings[0]._4_4_ = 0; tf_varyings[0]._4_4_ < 0xf;
      tf_varyings[0]._4_4_ = tf_varyings[0]._4_4_ + 1) {
    GVar3 = (**(code **)(lVar6 + 0x3c8))();
    this->m_po_ids[tf_varyings[0]._4_4_] = GVar3;
  }
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateProgram() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x10bd);
  pcStack_4c0 = "out_gs_1";
  for (fs_code_specialized.field_2._12_4_ = 0; (int)fs_code_specialized.field_2._12_4_ < 0xf;
      fs_code_specialized.field_2._12_4_ = fs_code_specialized.field_2._12_4_ + 1) {
    (**(code **)(lVar6 + 0x14c8))
              (this->m_po_ids[(int)fs_code_specialized.field_2._12_4_],1,&stack0xfffffffffffffb40,
               0x8c8c);
  }
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x10c6);
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x10cc);
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&fs_code_specialized_raw,&this->super_TestCaseBase,1,&dummy_fs_code);
  vs_code_specialized.field_2._8_8_ = std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&vs_code_specialized_raw,&this->super_TestCaseBase,1,&dummy_vs_code);
  pcStack_518 = (char *)std::__cxx11::string::c_str();
  for (gs_code._4_4_ = 0; gs_code._4_4_ < 0xf; gs_code._4_4_ = gs_code._4_4_ + 1) {
    gs_code_specialized.field_2._8_8_ = std::__cxx11::string::c_str();
    TestCaseBase::specializeShader_abi_cxx11_
              ((string *)&gs_code_specialized_raw,&this->super_TestCaseBase,1,
               (char **)((long)&gs_code_specialized.field_2 + 8));
    local_550 = (char *)std::__cxx11::string::c_str();
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_ids[gs_code._4_4_],this->m_fs_id,1,
                       (char **)((long)&vs_code_specialized.field_2 + 8),this->m_gs_id,1,&local_550,
                       this->m_vs_id,1,&stack0xfffffffffffffae8,(bool *)((long)tf_modes + 7));
    if (!bVar1) {
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&j_1,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&j_1,
                          (char (*) [62])
                          "Program object linking failed whereas a success was expected.");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&j_1);
      tf_modes[1]._2_1_ = 0;
    }
    std::__cxx11::string::~string((string *)&gs_code_specialized_raw);
  }
  if ((tf_modes[1]._2_1_ & 1) != 0) {
    (**(code **)(lVar6 + 0x708))(1,&this->m_vao_id);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glGenVertexArrays() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x10ef);
    (**(code **)(lVar6 + 0xd8))(this->m_vao_id);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glBindVertexArray() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x10f2);
    (**(code **)(lVar6 + 0x6c8))(1,&this->m_tfbo_id);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glGenBuffers() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x10f6);
    (**(code **)(lVar6 + 0x40))(0x8892,this->m_tfbo_id);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glBindBuffer() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x10f9);
    (**(code **)(lVar6 + 0x150))(0x8892,0x18,0,0x88e1);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glBufferData() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x10fe);
    (**(code **)(lVar6 + 0x48))(0x8c8e,0,this->m_tfbo_id);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glBindBufferBase() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x1101);
    (**(code **)(lVar6 + 0x5e0))(0x8c89);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glEnable() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x1104);
    k = 0;
    while( true ) {
      local_9c5 = 0;
      if (k < 3) {
        local_9c5 = tf_modes[1]._2_1_;
      }
      if ((local_9c5 & 1) == 0) break;
      local_6d8 = 0;
      while( true ) {
        local_9c6 = 0;
        if (local_6d8 < 5) {
          local_9c6 = tf_modes[1]._2_1_;
        }
        if ((local_9c6 & 1) == 0) break;
        for (local_6dc = 0; local_6dc < 3; local_6dc = local_6dc + 1) {
          (**(code **)(lVar6 + 0x1680))(this->m_po_ids[local_6dc + local_6d8 * 3]);
          dVar4 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar4,"glUseProgram() call(s) failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x110e);
          (**(code **)(lVar6 + 0x30))(draw_call_modes[(long)k + 4]);
          dVar4 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar4,"glBeginTransformFeedback() call(s) failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x1111);
          (**(code **)(lVar6 + 0xfe0))();
          dVar4 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar4,"glPauseTransformFeedback() call(s) failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x1114);
          (**(code **)(lVar6 + 0x538))(draw_call_modes[(long)local_6d8 + -2],0,3);
          i._4_4_ = (**(code **)(lVar6 + 0x800))();
          (**(code **)(lVar6 + 0x1248))();
          dVar4 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar4,"glResumeTransformFeedback() call(s) failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x111a);
          (**(code **)(lVar6 + 0x638))();
          dVar4 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar4,"glEndTransformFeedback() call(s) failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x111d);
          if (i._4_4_ != 0) {
            pTVar7 = tcu::TestContext::getLog
                               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_860,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (&local_860,
                                (char (*) [76])
                                "glDrawArrays() call generated an error while transform feedback was paused."
                               );
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_860);
            tf_modes[1]._2_1_ = 0;
            break;
          }
        }
        local_6d8 = local_6d8 + 1;
      }
      k = k + 1;
    }
    (**(code **)(lVar6 + 0x4e8))(0x8c89);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glDisable() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x112e);
  }
  if ((tf_modes[1]._2_1_ & 1) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  std::__cxx11::string::~string((string *)&vs_code_specialized_raw);
  std::__cxx11::string::~string((string *)&fs_code_specialized_raw);
  local_a00 = (string *)(gs_codes[0xe].field_2._M_local_buf + 8);
  do {
    local_a00 = local_a00 + -0x20;
    std::__cxx11::string::~string(local_a00);
  } while (local_a00 != local_3a8);
  local_a18 = (string *)(gs_max_output_vertices[2].field_2._M_local_buf + 8);
  do {
    local_a18 = local_a18 + -0x20;
    std::__cxx11::string::~string(local_a18);
  } while (local_a18 != local_1b8);
  local_a58 = (string *)(gs_outputs[2].field_2._M_local_buf + 8);
  do {
    local_a58 = local_a58 + -0x20;
    std::__cxx11::string::~string(local_a58);
  } while (local_a58 != local_148);
  local_a78 = (string *)(gs_inputs[4].field_2._M_local_buf + 8);
  do {
    local_a78 = local_a78 + -0x20;
    std::__cxx11::string::~string(local_a78);
  } while (local_a78 != local_b8);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderDrawCallsWhileTFPaused::iterate()
{
	/* Define 15 (all combinations of possible inputs and outputs in geometry shader) Geometry Shaders for purpose of this test. */
	const std::string gs_inputs[]  = { "points", "lines", "lines_adjacency", "triangles", "triangles_adjacency" };
	const std::string gs_outputs[] = { "points", "line_strip", "triangle_strip" };
	const std::string gs_max_output_vertices[] = { "1", "2", "3" };

	const unsigned short number_of_combinations =
		(sizeof(gs_inputs) / sizeof(gs_inputs[0]) * (sizeof(gs_outputs) / sizeof(gs_outputs[0])));

	std::string gs_codes[number_of_combinations];
	glw::GLenum errorCode;

	for (size_t i = 0; i < (sizeof(gs_inputs) / sizeof(gs_inputs[0])) /*5 possible GS inputs*/; ++i)
	{
		for (size_t j = 0; j < (sizeof(gs_outputs) / sizeof(gs_outputs[0])) /*3 possible GS outputs*/; ++j)
		{
			/* This shader will not emit primitives for anything but points.
			 * We do so, because we just need to make sure that, while transform feedback
			 * is paused, all draw calls executed with an active program object which
			 * includes a geometry shader, are valid.
			 */
			gs_codes[j + 3 * i] = "${VERSION}\n"
								  "${GEOMETRY_SHADER_REQUIRE}\n"
								  "\n"
								  "layout (" +
								  gs_inputs[i] + ") in;\n"
												 "layout (" +
								  gs_outputs[j] + ", max_vertices = " + gs_max_output_vertices[j] +
								  ") out;\n"
								  "\n"
								  "out vec2 out_gs_1;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    out_gs_1    = vec2(1.0, 2.0);\n"
								  "    gl_Position = vec4(0, 0, 0, 1);\n"
								  "    EmitVertex();\n"
								  "}\n";
		}
	}

	bool			  has_shader_compilation_failed = true;
	bool			  result						= true;
	const glw::GLuint tf_modes[3]					= { GL_POINTS, GL_LINES, GL_TRIANGLES };
	const glw::GLuint draw_call_modes[5]			= { GL_POINTS, GL_LINES, GL_LINES_ADJACENCY, GL_TRIANGLES,
											 GL_TRIANGLES_ADJACENCY };

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program objects. */
	for (int i = 0; i < number_of_combinations; ++i)
	{
		m_po_ids[i] = gl.createProgram();
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call(s) failed.");

	/* Specify output variables to be captured. */
	const char* tf_varyings[] = { "out_gs_1" };

	for (int i = 0; i < number_of_combinations; ++i)
	{
		gl.transformFeedbackVaryings(m_po_ids[i], 1 /*count*/, tf_varyings, GL_INTERLEAVED_ATTRIBS);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call(s) failed.");

	/* Create shader objects. */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Try to link the test program object */
	std::string fs_code_specialized		= specializeShader(1, &dummy_fs_code);
	const char* fs_code_specialized_raw = fs_code_specialized.c_str();

	std::string vs_code_specialized		= specializeShader(1, &dummy_vs_code);
	const char* vs_code_specialized_raw = vs_code_specialized.c_str();

	for (int i = 0; i < number_of_combinations; ++i)
	{
		const char* gs_code					= gs_codes[i].c_str();
		std::string gs_code_specialized		= specializeShader(1, &gs_code);
		const char* gs_code_specialized_raw = gs_code_specialized.c_str();

		if (!TestCaseBase::buildProgram(m_po_ids[i], m_fs_id, 1,			  /* n_sh1_body_parts */
										&fs_code_specialized_raw, m_gs_id, 1, /* n_sh2_body_parts */
										&gs_code_specialized_raw, m_vs_id, 1, /* n_sh3_body_parts */
										&vs_code_specialized_raw, &has_shader_compilation_failed))
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Program object linking failed whereas a success was expected."
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	}

	if (!result)
	{
		goto end;
	}

	/* Create Vertex Array Object. */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call(s) failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call(s) failed.");

	/* Create Buffer Object for Transform Feedback data. */
	gl.genBuffers(1, &m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call(s) failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call(s) failed.");

	gl.bufferData(GL_ARRAY_BUFFER,
				  sizeof(glw::GLfloat) * 2 * 3 /* capture 2 float vector components times 3 triangle vertices */, NULL,
				  GL_STREAM_READ);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call(s) failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /*binding index*/, m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call(s) failed.");

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable() call(s) failed.");

	for (int i = 0; i < 3 /* number of TF modes */ && result; ++i)
	{
		for (int j = 0; j < 5 /*number of draw call modes*/ && result; ++j)
		{
			for (int k = 0; k < 3 /* number of output GS primitive types */; ++k)
			{
				/* Turn on program object. */
				gl.useProgram(m_po_ids[k + 3 * j]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call(s) failed.");

				gl.beginTransformFeedback(tf_modes[i]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call(s) failed.");

				gl.pauseTransformFeedback();
				GLU_EXPECT_NO_ERROR(gl.getError(), "glPauseTransformFeedback() call(s) failed.");

				gl.drawArrays(draw_call_modes[j], 0 /*first*/, 3 /*count*/);
				errorCode = gl.getError();

				gl.resumeTransformFeedback();
				GLU_EXPECT_NO_ERROR(gl.getError(), "glResumeTransformFeedback() call(s) failed.");

				gl.endTransformFeedback();
				GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call(s) failed.");

				/* If draw call fails stop test execution. */
				if (GL_NO_ERROR != errorCode)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "glDrawArrays() call generated an error while transform feedback was paused."
									   << tcu::TestLog::EndMessage;

					result = false;
					break;
				}
			}
		}
	}

	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable() call(s) failed.");

end:

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}